

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall
cmFindLibraryHelper::RegexFromLiteral(cmFindLibraryHelper *this,string *out,string *in)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char ch;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator ci;
  string *in_local;
  string *out_local;
  cmFindLibraryHelper *this_local;
  
  ci._M_current = (char *)in;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    _Stack_30._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    cVar1 = *pcVar3;
    if (((((cVar1 == '[') || (cVar1 == ']')) || (cVar1 == '(')) ||
        ((((cVar1 == ')' || (cVar1 == '\\')) ||
          ((cVar1 == '.' || ((cVar1 == '*' || (cVar1 == '+')))))) || (cVar1 == '?')))) ||
       (((cVar1 == '-' || (cVar1 == '^')) || (cVar1 == '$')))) {
      std::__cxx11::string::operator+=((string *)out,"\\");
    }
    std::__cxx11::string::operator+=((string *)out,cVar1);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void cmFindLibraryHelper::RegexFromLiteral(std::string& out,
                                           std::string const& in)
{
  for(std::string::const_iterator ci = in.begin(); ci != in.end(); ++ci)
    {
    char ch = *ci;
    if(ch == '[' || ch == ']' || ch == '(' || ch == ')' || ch == '\\' ||
       ch == '.' || ch == '*' || ch == '+' || ch == '?' || ch == '-' ||
       ch == '^' || ch == '$')
      {
      out += "\\";
      }
#if defined(_WIN32) || defined(__APPLE__)
    out += tolower(ch);
#else
    out += ch;
#endif
    }
}